

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O1

string * dtc::anon_unknown_3::dirbasename
                   (string *__return_storage_ptr__,function<char_*(char_*)> *fn,string *s)

{
  char *__ptr;
  char *__s;
  undefined8 uVar1;
  char *local_38;
  undefined8 local_30;
  char local_28 [16];
  
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = '\0';
  if (s->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    __ptr = strdup((s->_M_dataplus)._M_p);
    local_38 = __ptr;
    if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
      uVar1 = std::__throw_bad_function_call();
      if (__ptr != (char *)0x0) {
        free(__ptr);
      }
      _Unwind_Resume(uVar1);
    }
    __s = (*fn->_M_invoker)((_Any_data *)fn,&local_38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_38);
    if (__ptr != (char *)0x0) {
      free(__ptr);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string
dirbasename(std::function<char*(char*)> fn, const string &s)
{
	if (s == string())
	{
		return string();
	}
	std::unique_ptr<char, decltype(free)*> str = {strdup(s.c_str()), free};
	string dn(fn(str.get()));
	return dn;
}